

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UnicodeString *
icu_63::operator+(UnicodeString *__return_storage_ptr__,UnicodeString *s1,UnicodeString *s2)

{
  short sVar1;
  int iVar2;
  UnicodeString *pUVar3;
  int iVar4;
  int32_t iVar5;
  UnicodeString local_58;
  
  sVar1 = (s1->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (s1->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  sVar1 = (s2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (s2->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  local_58.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00401be0;
  local_58.fUnion.fStackFields.fLengthAndFlags = 0;
  UnicodeString::allocate(&local_58,iVar2 + iVar4 + 1);
  sVar1 = (s1->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (s1->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  pUVar3 = UnicodeString::doAppend(&local_58,s1,0,iVar5);
  sVar1 = (s2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (s2->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  pUVar3 = UnicodeString::doAppend(pUVar3,s2,0,iVar5);
  UnicodeString::UnicodeString(__return_storage_ptr__,pUVar3);
  UnicodeString::~UnicodeString(&local_58);
  return __return_storage_ptr__;
}

Assistant:

U_EXPORT2
operator+ (const UnicodeString &s1, const UnicodeString &s2) {
    return
        UnicodeString(s1.length()+s2.length()+1, (UChar32)0, 0).
            append(s1).
                append(s2);
}